

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O1

iterator llvm::skipLeadingZeroesAndAnyDot(iterator begin,iterator end,iterator *dot)

{
  char *pcVar1;
  
  *dot = end;
  pcVar1 = begin;
  if (begin == end) {
    return begin;
  }
  while (*pcVar1 == '0') {
    pcVar1 = pcVar1 + 1;
    if (pcVar1 == end) {
      return end;
    }
  }
  if (*pcVar1 != '.') {
    return pcVar1;
  }
  *dot = pcVar1;
  if ((long)end - (long)begin != 1) {
    do {
      pcVar1 = pcVar1 + 1;
      if (pcVar1 == end) {
        return begin + ((long)end - (long)begin);
      }
    } while (*pcVar1 == '0');
    return pcVar1;
  }
  __assert_fail("end - begin != 1 && \"Significand has no digits\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                ,299,
                "StringRef::iterator llvm::skipLeadingZeroesAndAnyDot(StringRef::iterator, StringRef::iterator, StringRef::iterator *)"
               );
}

Assistant:

static StringRef::iterator
skipLeadingZeroesAndAnyDot(StringRef::iterator begin, StringRef::iterator end,
                           StringRef::iterator *dot)
{
  StringRef::iterator p = begin;
  *dot = end;
  while (p != end && *p == '0')
    p++;

  if (p != end && *p == '.') {
    *dot = p++;

    assert(end - begin != 1 && "Significand has no digits");

    while (p != end && *p == '0')
      p++;
  }

  return p;
}